

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall smf::MidiMessage::makeNoteOff(MidiMessage *this,int channel,int key,int velocity)

{
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,3);
  *(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data
   ._M_start = (byte)channel & 0xf | 0x80;
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = (byte)key & 0x7f;
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = (byte)velocity & 0x7f;
  return;
}

Assistant:

void MidiMessage::makeNoteOff(int channel, int key, int velocity) {
	resize(3);
	(*this)[0] = 0x80 | (0x0f & channel);
	(*this)[1] = key & 0x7f;
	(*this)[2] = velocity & 0x7f;
}